

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

void __thiscall Js::JavascriptRegExp::CacheLastIndex(JavascriptRegExp *this)

{
  Var aValue;
  bool bVar1;
  BOOL BVar2;
  void **ppvVar3;
  ScriptContext *scriptContext;
  double value;
  double v;
  JavascriptRegExp *this_local;
  
  ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->lastIndexVar)
  ;
  if (*ppvVar3 == (void *)0x0) {
    this->lastIndexOrFlag = 0;
  }
  else {
    ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->lastIndexVar);
    aValue = *ppvVar3;
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    value = JavascriptConversion::ToInteger(aValue,scriptContext);
    BVar2 = JavascriptNumber::IsNan(value);
    if (BVar2 == 0) {
      bVar1 = JavascriptNumber::IsPosInf(value);
      if ((((bVar1) || (bVar1 = JavascriptNumber::IsNegInf(value), bVar1)) || (value < 0.0)) ||
         (2147483646.0 < value)) {
        this->lastIndexOrFlag = 0xffffffff;
      }
      else {
        this->lastIndexOrFlag = (Type)(long)value;
      }
    }
    else {
      this->lastIndexOrFlag = 0;
    }
  }
  return;
}

Assistant:

void JavascriptRegExp::CacheLastIndex()
    {
        if (lastIndexVar == nullptr)
            lastIndexOrFlag = 0;
        else
        {
            // Does ToInteger(lastIndex) yield an integer in [0, MaxCharCount]?
            double v = JavascriptConversion::ToInteger(lastIndexVar, GetScriptContext());
            if (JavascriptNumber::IsNan(v))
                lastIndexOrFlag = 0;
            else if (JavascriptNumber::IsPosInf(v) ||
                JavascriptNumber::IsNegInf(v) ||
                v < 0.0 ||
                v > (double)MaxCharCount)
                lastIndexOrFlag = InvalidValue;
            else
                lastIndexOrFlag = (CharCount)v;
        }
    }